

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O0

void __thiscall
fmt::v6::internal::basic_writer<fmt::v6::buffer_range<char>>::
padded_int_writer<fmt::v6::internal::basic_writer<fmt::v6::buffer_range<char>>::int_writer<long_long,fmt::v6::basic_format_specs<char>>::bin_writer<1>>
::operator()(padded_int_writer<fmt::v6::internal::basic_writer<fmt::v6::buffer_range<char>_>::int_writer<long_long,_fmt::v6::basic_format_specs<char>_>::bin_writer<1>_>
             *this,char **it)

{
  size_t sVar1;
  char *pcVar2;
  char *in_RSI;
  unsigned_long in_RDI;
  char *unaff_retaddr;
  char **in_stack_ffffffffffffffd8;
  bin_writer<1> *in_stack_ffffffffffffffe0;
  unsigned_long __n;
  
  __n = in_RDI;
  sVar1 = basic_string_view<char>::size((basic_string_view<char> *)(in_RDI + 8));
  if (sVar1 != 0) {
    in_stack_ffffffffffffffe0 =
         (bin_writer<1> *)basic_string_view<char>::begin((basic_string_view<char> *)(in_RDI + 8));
    basic_string_view<char>::end((basic_string_view<char> *)(in_RDI + 8));
    pcVar2 = copy_str<char,_const_char_*,_char_*,_0>
                       ((char *)in_stack_ffffffffffffffe0,(char *)in_stack_ffffffffffffffd8,
                        (char *)0x14739d);
    *(char **)in_RSI = pcVar2;
  }
  pcVar2 = std::fill_n<char*,unsigned_long,char>(unaff_retaddr,__n,in_RSI);
  *(char **)in_RSI = pcVar2;
  int_writer<long_long,fmt::v6::basic_format_specs<char>>::bin_writer<1>::operator()
            (in_stack_ffffffffffffffe0,in_stack_ffffffffffffffd8);
  return;
}

Assistant:

void operator()(It&& it) const {
      if (prefix.size() != 0)
        it = copy_str<char_type>(prefix.begin(), prefix.end(), it);
      it = std::fill_n(it, padding, fill);
      f(it);
    }